

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

void __thiscall
presolve::HPresolve::shrinkProblem(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  double *pdVar1;
  double dVar2;
  pointer pbVar3;
  pointer pbVar4;
  pointer pHVar5;
  pointer pbVar6;
  pointer puVar7;
  pointer piVar8;
  pointer psVar9;
  pointer pdVar10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var11;
  int *piVar12;
  pair<int,_int> *ppVar13;
  pair<int,_int> *ppVar14;
  HighsMipSolver *mipsolver;
  HighsMipSolverData *pHVar15;
  void *pvVar16;
  HighsOptions *pHVar17;
  pointer puVar18;
  uint uVar19;
  _Rb_tree_node_base *p_Var20;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var21;
  pointer piVar22;
  HighsLp *pHVar23;
  int iVar24;
  HighsInt *singCol;
  long lVar25;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var26;
  iterator __first;
  pair<int,_int> *ppVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *p_Var31;
  long lVar32;
  pair<std::_Rb_tree_iterator<std::pair<int,_int>_>,_bool> pVar33;
  vector<int,_std::allocator<int>_> newColIndex;
  vector<int,_std::allocator<int>_> newRowIndex;
  set<int,_std::less<int>,_std::allocator<int>_> newSet;
  vector<int,_std::allocator<int>_> local_3c0;
  vector<int,_std::allocator<int>_> local_3a8;
  pointer local_390;
  HighsPostsolveStack *local_388;
  ulong local_380;
  pointer local_378;
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  *local_370;
  undefined1 local_368 [16];
  _Base_ptr local_358;
  _Base_ptr p_Stack_350;
  _Base_ptr p_Stack_348;
  pointer piStack_340;
  pointer ppStack_338;
  pointer ppStack_330;
  pointer local_328;
  pointer pHStack_320;
  pointer pHStack_318;
  pointer pHStack_310;
  pointer pHStack_308;
  pointer ppStack_300;
  pointer local_2f8;
  pointer ppStack_2f0;
  _Rb_tree_node_base local_2e0;
  pointer local_2c0;
  pointer local_2b8;
  pointer pHStack_2b0;
  pointer local_2a8;
  pointer local_2a0;
  pointer ppCStack_298;
  pointer local_290;
  
  uVar19 = this->model->num_col_;
  this->model->num_col_ = 0;
  local_388 = postsolve_stack;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_3c0,(long)(int)uVar19,(allocator_type *)local_368);
  uVar30 = (ulong)uVar19;
  pbVar3 = (this->model->col_names_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (this->model->col_names_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_380 = uVar30;
  if ((long)(int)uVar19 != 0) {
    lVar32 = 0;
    lVar28 = 0;
    uVar29 = 0;
    do {
      if ((this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar29] == '\0') {
        pHVar23 = this->model;
        iVar24 = pHVar23->num_col_;
        lVar25 = (long)iVar24;
        pHVar23->num_col_ = iVar24 + 1;
        local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar29] = iVar24;
        if (lVar25 < (long)uVar29) {
          pdVar10 = (pHVar23->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start;
          pdVar10[lVar25] = pdVar10[uVar29];
          pdVar10 = (pHVar23->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pdVar10[lVar25] = pdVar10[uVar29];
          pdVar10 = (pHVar23->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pdVar10[lVar25] = pdVar10[uVar29];
          pHVar5 = (pHVar23->integrality_).
                   super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pHVar5[lVar25] = pHVar5[uVar29];
          pdVar10 = (this->implColLower).super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start;
          pdVar10[lVar25] = pdVar10[uVar29];
          pdVar10 = (this->implColUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start;
          pdVar10[lVar25] = pdVar10[uVar29];
          piVar8 = (this->colLowerSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8[lVar25] = piVar8[uVar29];
          piVar8 = (this->colUpperSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8[local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar29]] = piVar8[uVar29];
          psVar9 = (this->implRowDualSourceByCol).
                   super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          operator=(&psVar9[local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar29]]._M_t,
                    (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *
                    )((long)&(psVar9->_M_t)._M_impl.field_0x0 + lVar28));
          piVar8 = (this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8[local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar29]] = piVar8[uVar29];
          piVar8 = (this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8[local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar29]] = piVar8[uVar29];
          if (pbVar4 != pbVar3) {
            pbVar6 = (this->model->col_names_).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            std::__cxx11::string::operator=
                      ((string *)
                       (pbVar6 + local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar29]),
                       (string *)((long)&(pbVar6->_M_dataplus)._M_p + lVar32));
          }
          puVar7 = (this->changedColFlag).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar7[local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar29]] = puVar7[uVar29];
          uVar30 = local_380;
        }
      }
      else {
        local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar29] = -1;
      }
      uVar29 = uVar29 + 1;
      lVar28 = lVar28 + 0x30;
      lVar32 = lVar32 + 0x20;
    } while (uVar30 != uVar29);
  }
  local_368._0_8_ = local_368._0_8_ & 0xffffffffffffff00;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_assign
            (&this->colDeleted,(long)this->model->num_col_,local_368);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->model->col_cost_,(long)this->model->num_col_);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->model->col_lower_,(long)this->model->num_col_);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->model->col_upper_,(long)this->model->num_col_);
  std::vector<HighsVarType,_std::allocator<HighsVarType>_>::resize
            (&this->model->integrality_,(long)this->model->num_col_);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->implColLower,(long)this->model->num_col_);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->implColUpper,(long)this->model->num_col_);
  std::vector<int,_std::allocator<int>_>::resize(&this->colLowerSource,(long)this->model->num_col_);
  std::vector<int,_std::allocator<int>_>::resize(&this->colUpperSource,(long)this->model->num_col_);
  local_370 = &this->implRowDualSourceByCol;
  std::
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  ::resize(local_370,(long)this->model->num_col_);
  std::vector<int,_std::allocator<int>_>::resize(&this->colhead,(long)this->model->num_col_);
  std::vector<int,_std::allocator<int>_>::resize(&this->colsize,(long)this->model->num_col_);
  if (pbVar4 != pbVar3) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&this->model->col_names_,(long)this->model->num_col_);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->changedColFlag,(long)this->model->num_col_);
  this->numDeletedCols = 0;
  pHVar23 = this->model;
  uVar19 = pHVar23->num_row_;
  pbVar3 = (pHVar23->row_names_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_378 = (pHVar23->row_names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  pHVar23->num_row_ = 0;
  local_390 = (pointer)&this->colUpperSource;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_3a8,(long)(int)uVar19,(allocator_type *)local_368);
  if ((ulong)uVar19 != 0) {
    lVar32 = 0;
    lVar28 = 0;
    uVar30 = 0;
    do {
      if ((this->rowDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar30] == '\0') {
        pHVar23 = this->model;
        iVar24 = pHVar23->num_row_;
        lVar25 = (long)iVar24;
        pHVar23->num_row_ = iVar24 + 1;
        local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar30] = iVar24;
        if (lVar25 < (long)uVar30) {
          pdVar10 = (pHVar23->row_lower_).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pdVar10[lVar25] = pdVar10[uVar30];
          pdVar10 = (pHVar23->row_upper_).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pdVar10[lVar25] = pdVar10[uVar30];
          pdVar10 = (this->rowDualLower).super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start;
          pdVar10[lVar25] = pdVar10[uVar30];
          pdVar10 = (this->rowDualUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start;
          pdVar10[lVar25] = pdVar10[uVar30];
          pdVar10 = (this->implRowDualLower).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pdVar10[lVar25] = pdVar10[uVar30];
          pdVar10 = (this->implRowDualUpper).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pdVar10[lVar25] = pdVar10[uVar30];
          piVar8 = (this->rowDualLowerSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8[lVar25] = piVar8[uVar30];
          piVar8 = (this->rowDualUpperSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8[local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar30]] = piVar8[uVar30];
          psVar9 = (this->colImplSourceByRow).
                   super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          operator=(&psVar9[local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar30]]._M_t,
                    (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *
                    )((long)&(psVar9->_M_t)._M_impl.field_0x0 + lVar28));
          piVar8 = (this->rowroot).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8[local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar30]] = piVar8[uVar30];
          piVar8 = (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8[local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar30]] = piVar8[uVar30];
          piVar8 = (this->rowsizeInteger).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8[local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar30]] = piVar8[uVar30];
          piVar8 = (this->rowsizeImplInt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8[local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar30]] = piVar8[uVar30];
          if (local_378 != pbVar3) {
            pbVar4 = (this->model->row_names_).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            std::__cxx11::string::operator=
                      ((string *)
                       (pbVar4 + local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar30]),
                       (string *)((long)&(pbVar4->_M_dataplus)._M_p + lVar32));
          }
          puVar7 = (this->changedRowFlag).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar7[local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar30]] = puVar7[uVar30];
        }
      }
      else {
        local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar30] = -1;
      }
      uVar30 = uVar30 + 1;
      lVar28 = lVar28 + 0x30;
      lVar32 = lVar32 + 0x20;
    } while (uVar19 != uVar30);
  }
  pHVar23 = this->model;
  if (pHVar23->num_col_ != 0) {
    piVar8 = (this->colLowerSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar22 = (((_Vector_base<int,_std::allocator<int>_> *)&local_390->_M_dataplus)->_M_impl).
              super__Vector_impl_data._M_start;
    uVar30 = 0;
    do {
      lVar28 = (long)piVar8[uVar30];
      if (lVar28 != -1) {
        piVar8[uVar30] =
             local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[lVar28];
      }
      lVar28 = (long)piVar22[uVar30];
      if (lVar28 != -1) {
        piVar22[uVar30] =
             local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[lVar28];
      }
      uVar30 = uVar30 + 1;
    } while (uVar30 != (uint)pHVar23->num_col_);
  }
  if (pHVar23->num_row_ != 0) {
    piVar8 = (this->rowDualLowerSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar22 = (this->rowDualUpperSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar30 = 0;
    do {
      lVar28 = (long)piVar8[uVar30];
      if (lVar28 != -1) {
        piVar8[uVar30] =
             local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[lVar28];
      }
      lVar28 = (long)piVar22[uVar30];
      if (lVar28 != -1) {
        piVar22[uVar30] =
             local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[lVar28];
      }
      uVar30 = uVar30 + 1;
    } while (uVar30 != (uint)pHVar23->num_row_);
  }
  local_390 = pbVar3;
  if (this->model->num_col_ != 0) {
    uVar30 = 0;
    do {
      local_368._8_8_ = local_368._8_8_ & 0xffffffff00000000;
      local_358 = (_Base_ptr)0x0;
      p_Stack_350 = (_Base_ptr)(local_368 + 8);
      piStack_340 = (pointer)0x0;
      psVar9 = (local_370->
               super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      p_Stack_348 = p_Stack_350;
      for (p_Var20 = *(_Base_ptr *)((long)&psVar9[uVar30]._M_t._M_impl.super__Rb_tree_header + 0x10)
          ; p_Var20 != &psVar9[uVar30]._M_t._M_impl.super__Rb_tree_header._M_header;
          p_Var20 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var20)) {
        if (local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[(int)p_Var20[1]._M_color] != -1) {
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_emplace_unique<int&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     local_368,
                     local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + (int)p_Var20[1]._M_color);
        }
      }
      p_Var31 = &(local_370->
                 super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[uVar30]._M_t;
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
                (p_Var31);
      if (local_358 != (_Base_ptr)0x0) {
        (p_Var31->_M_impl).super__Rb_tree_header._M_header._M_color = local_368._8_4_;
        (p_Var31->_M_impl).super__Rb_tree_header._M_header._M_parent = local_358;
        (p_Var31->_M_impl).super__Rb_tree_header._M_header._M_left = p_Stack_350;
        (p_Var31->_M_impl).super__Rb_tree_header._M_header._M_right = p_Stack_348;
        local_358->_M_parent = &(p_Var31->_M_impl).super__Rb_tree_header._M_header;
        (p_Var31->_M_impl).super__Rb_tree_header._M_node_count = (size_t)piStack_340;
        local_358 = (_Base_ptr)0x0;
        p_Stack_350 = (_Base_ptr)(local_368 + 8);
        piStack_340 = (pointer)0x0;
        p_Stack_348 = p_Stack_350;
      }
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 local_368);
      uVar30 = uVar30 + 1;
    } while (uVar30 != (uint)this->model->num_col_);
  }
  uVar19 = this->model->num_row_;
  if (uVar19 != 0) {
    uVar30 = 0;
    do {
      local_368._8_8_ = local_368._8_8_ & 0xffffffff00000000;
      local_358 = (_Base_ptr)0x0;
      p_Stack_350 = (_Base_ptr)(local_368 + 8);
      piStack_340 = (pointer)0x0;
      psVar9 = (this->colImplSourceByRow).
               super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      p_Stack_348 = p_Stack_350;
      for (p_Var20 = *(_Base_ptr *)((long)&psVar9[uVar30]._M_t._M_impl.super__Rb_tree_header + 0x10)
          ; p_Var20 != &psVar9[uVar30]._M_t._M_impl.super__Rb_tree_header._M_header;
          p_Var20 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var20)) {
        if (local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[(int)p_Var20[1]._M_color] != -1) {
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_emplace_unique<int&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     local_368,
                     local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + (int)p_Var20[1]._M_color);
        }
      }
      p_Var31 = &(this->colImplSourceByRow).
                 super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar30]._M_t;
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
                (p_Var31);
      if (local_358 != (_Base_ptr)0x0) {
        (p_Var31->_M_impl).super__Rb_tree_header._M_header._M_color = local_368._8_4_;
        (p_Var31->_M_impl).super__Rb_tree_header._M_header._M_parent = local_358;
        (p_Var31->_M_impl).super__Rb_tree_header._M_header._M_left = p_Stack_350;
        (p_Var31->_M_impl).super__Rb_tree_header._M_header._M_right = p_Stack_348;
        local_358->_M_parent = &(p_Var31->_M_impl).super__Rb_tree_header._M_header;
        (p_Var31->_M_impl).super__Rb_tree_header._M_node_count = (size_t)piStack_340;
        local_358 = (_Base_ptr)0x0;
        p_Stack_350 = (_Base_ptr)(local_368 + 8);
        piStack_340 = (pointer)0x0;
        p_Stack_348 = p_Stack_350;
      }
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 local_368);
      uVar30 = uVar30 + 1;
      uVar19 = this->model->num_row_;
    } while (uVar30 != uVar19);
  }
  local_368._0_8_ = local_368._0_8_ & 0xffffffffffffff00;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_assign
            (&this->rowDeleted,(long)(int)uVar19,local_368);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->model->row_lower_,(long)this->model->num_row_);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->model->row_upper_,(long)this->model->num_row_);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->rowDualLower,(long)this->model->num_row_);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->rowDualUpper,(long)this->model->num_row_);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->implRowDualLower,(long)this->model->num_row_);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->implRowDualUpper,(long)this->model->num_row_);
  std::vector<int,_std::allocator<int>_>::resize
            (&this->rowDualLowerSource,(long)this->model->num_row_);
  std::vector<int,_std::allocator<int>_>::resize
            (&this->rowDualUpperSource,(long)this->model->num_row_);
  std::
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  ::resize(&this->colImplSourceByRow,(long)this->model->num_row_);
  std::vector<int,_std::allocator<int>_>::resize(&this->rowroot,(long)this->model->num_row_);
  std::vector<int,_std::allocator<int>_>::resize(&this->rowsize,(long)this->model->num_row_);
  std::vector<int,_std::allocator<int>_>::resize(&this->rowsizeInteger,(long)this->model->num_row_);
  std::vector<int,_std::allocator<int>_>::resize(&this->rowsizeImplInt,(long)this->model->num_row_);
  if (local_378 != local_390) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&this->model->row_names_,(long)this->model->num_row_);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->changedRowFlag,(long)this->model->num_row_);
  this->numDeletedRows = 0;
  HighsPostsolveStack::compressIndexMaps(local_388,&local_3a8,&local_3c0);
  HighsLinearSumBounds::shrink(&this->impliedRowBounds,&local_3a8,this->model->num_row_);
  HighsLinearSumBounds::shrink(&this->impliedDualRowBounds,&local_3c0,this->model->num_col_);
  pdVar10 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar30 = (ulong)((long)(this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pdVar10) >> 3;
  if ((int)uVar30 != 0) {
    piVar8 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar22 = (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar29 = 0;
    do {
      dVar2 = pdVar10[uVar29];
      if ((dVar2 != 0.0) || (NAN(dVar2))) {
        piVar22[uVar29] =
             local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[piVar22[uVar29]];
        piVar8[uVar29] =
             local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[piVar8[uVar29]];
      }
      uVar29 = uVar29 + 1;
    } while ((uVar30 & 0xffffffff) != uVar29);
  }
  _Var11._M_current =
       (this->singletonColumns).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  _Var21._M_current =
       (this->singletonColumns).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  for (_Var26._M_current = _Var21._M_current; _Var26._M_current != _Var11._M_current;
      _Var26._M_current = _Var26._M_current + 1) {
    *_Var26._M_current =
         local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start[*_Var26._M_current];
  }
  local_368._0_4_ = -1;
  _Var21 = std::
           __remove_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                     (_Var21,_Var11,(_Iter_equals_val<const_int>)local_368);
  piVar12 = (this->singletonColumns).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((_Var21._M_current != piVar12) &&
     (piVar8 = (this->singletonColumns).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,
     piVar22 = (pointer)((long)_Var21._M_current + ((long)piVar8 - (long)piVar12)),
     piVar8 != piVar22)) {
    (this->singletonColumns).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar22;
  }
  _Var11._M_current =
       (this->changedColIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  _Var21._M_current =
       (this->changedColIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  for (_Var26._M_current = _Var21._M_current; _Var26._M_current != _Var11._M_current;
      _Var26._M_current = _Var26._M_current + 1) {
    *_Var26._M_current =
         local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start[*_Var26._M_current];
  }
  local_368._0_4_ = -1;
  _Var21 = std::
           __remove_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                     (_Var21,_Var11,(_Iter_equals_val<const_int>)local_368);
  piVar12 = (this->changedColIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((_Var21._M_current != piVar12) &&
     (piVar8 = (this->changedColIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,
     piVar22 = (pointer)((long)_Var21._M_current + ((long)piVar8 - (long)piVar12)),
     piVar8 != piVar22)) {
    (this->changedColIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar22;
  }
  _Var11._M_current =
       (this->singletonRows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  _Var21._M_current =
       (this->singletonRows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  for (_Var26._M_current = _Var21._M_current; _Var26._M_current != _Var11._M_current;
      _Var26._M_current = _Var26._M_current + 1) {
    *_Var26._M_current =
         local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start[*_Var26._M_current];
  }
  local_368._0_4_ = -1;
  _Var21 = std::
           __remove_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                     (_Var21,_Var11,(_Iter_equals_val<const_int>)local_368);
  piVar12 = (this->singletonRows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((_Var21._M_current != piVar12) &&
     (piVar8 = (this->singletonRows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,
     piVar22 = (pointer)((long)_Var21._M_current + ((long)piVar8 - (long)piVar12)),
     piVar8 != piVar22)) {
    (this->singletonRows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar22;
  }
  _Var11._M_current =
       (this->changedRowIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  _Var21._M_current =
       (this->changedRowIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  for (_Var26._M_current = _Var21._M_current; _Var26._M_current != _Var11._M_current;
      _Var26._M_current = _Var26._M_current + 1) {
    *_Var26._M_current =
         local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start[*_Var26._M_current];
  }
  local_368._0_4_ = 0xffffffff;
  _Var21 = std::
           __remove_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                     (_Var21,_Var11,(_Iter_equals_val<const_int>)local_368);
  piVar12 = (this->changedRowIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((_Var21._M_current != piVar12) &&
     (piVar8 = (this->changedRowIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,
     piVar22 = (pointer)((long)_Var21._M_current + ((long)piVar8 - (long)piVar12)),
     piVar8 != piVar22)) {
    (this->changedRowIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar22;
  }
  ppVar14 = (this->substitutionOpportunities).
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppVar13 = (this->substitutionOpportunities).
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start;
  for (ppVar27 = ppVar13; ppVar27 != ppVar14; ppVar27 = ppVar27 + 1) {
    if ((long)ppVar27->first != -1) {
      ppVar27->first =
           local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[ppVar27->first];
      ppVar27->second =
           local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[ppVar27->second];
    }
  }
  uVar30 = (long)ppVar14 - (long)ppVar13;
  ppVar27 = ppVar13;
  if (0 < (long)uVar30 >> 5) {
    ppVar27 = (pair<int,_int> *)((long)&ppVar13->first + (uVar30 & 0xffffffffffffffe0));
    lVar28 = ((long)uVar30 >> 5) + 1;
    __first._M_current = ppVar13 + 2;
    do {
      if ((__first._M_current[-2].first == -1) || (__first._M_current[-2].second == -1)) {
        __first._M_current = __first._M_current + -2;
        goto LAB_0030e731;
      }
      if ((__first._M_current[-1].first == -1) || (__first._M_current[-1].second == -1)) {
        __first._M_current = __first._M_current + -1;
        goto LAB_0030e731;
      }
      if (((__first._M_current)->first == -1) || ((__first._M_current)->second == -1))
      goto LAB_0030e731;
      if ((__first._M_current[1].first == -1) || (__first._M_current[1].second == -1)) {
        __first._M_current = __first._M_current + 1;
        goto LAB_0030e731;
      }
      lVar28 = lVar28 + -1;
      __first._M_current = __first._M_current + 4;
    } while (1 < lVar28);
  }
  lVar28 = (long)ppVar14 - (long)ppVar27 >> 3;
  if (lVar28 != 1) {
    __first._M_current = ppVar27;
    if (lVar28 != 2) {
      __first._M_current = ppVar14;
      if (((lVar28 != 3) || (__first._M_current = ppVar27, ppVar27->first == -1)) ||
         (ppVar27->second == -1)) goto LAB_0030e731;
      __first._M_current = ppVar27 + 1;
    }
    if (((__first._M_current)->first == -1) || ((__first._M_current)->second == -1))
    goto LAB_0030e731;
    ppVar27 = __first._M_current + 1;
  }
  __first._M_current = ppVar14;
  if (ppVar27->second == -1) {
    __first._M_current = ppVar27;
  }
  if (ppVar27->first == -1) {
    __first._M_current = ppVar27;
  }
LAB_0030e731:
  ppVar27 = __first._M_current + 1;
  if (ppVar27 != ppVar14 && __first._M_current != ppVar14) {
    do {
      if ((ppVar27->first != -1) && (ppVar27->second != -1)) {
        (__first._M_current)->first = ppVar27->first;
        (__first._M_current)->second = ppVar27->second;
        __first._M_current = __first._M_current + 1;
      }
      ppVar27 = ppVar27 + 1;
    } while (ppVar27 != ppVar14);
  }
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::_M_erase
            (&this->substitutionOpportunities,__first,ppVar13 + uVar30);
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::clear(&(this->equations)._M_t);
  local_368._0_8_ = &(this->equations)._M_t._M_impl.super__Rb_tree_header;
  std::
  vector<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
  ::_M_fill_assign(&this->eqiters,(long)this->model->num_row_,(value_type *)local_368);
  local_368._0_8_ = local_368._0_8_ & 0xffffffff00000000;
  pHVar23 = this->model;
  if (pHVar23->num_row_ != 0) {
    iVar24 = 0;
    do {
      dVar2 = (pHVar23->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar24];
      pdVar1 = (pHVar23->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + iVar24;
      if ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1))) {
        pVar33 = std::
                 _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                 ::_M_emplace_unique<int&,int&>
                           ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                             *)&this->equations,
                            (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + iVar24,(int *)local_368);
        (this->eqiters).
        super__Vector_base<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[(int)local_368._0_4_]._M_node =
             pVar33.first._M_node._M_node;
      }
      iVar24 = local_368._0_4_ + 1;
      local_368._0_4_ = iVar24;
      pHVar23 = this->model;
    } while (iVar24 != pHVar23->num_row_);
  }
  mipsolver = this->mipsolver;
  if (mipsolver != (HighsMipSolver *)0x0) {
    ((mipsolver->mipdata_)._M_t.
     super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
     super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
     super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->rowMatrixSet = false;
    HighsObjectiveFunction::HighsObjectiveFunction((HighsObjectiveFunction *)local_368,mipsolver);
    pHVar15 = (this->mipsolver->mipdata_)._M_t.
              super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
              _M_t.
              super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
              .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    *(_Base_ptr *)&(pHVar15->objectiveFunction).numIntegral = local_358;
    (pHVar15->objectiveFunction).model = (HighsLp *)local_368._0_8_;
    (pHVar15->objectiveFunction).objIntScale = (double)local_368._8_8_;
    pvVar16 = *(void **)&(pHVar15->objectiveFunction).objectiveNonzeros.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl;
    *(_Base_ptr *)
     &(pHVar15->objectiveFunction).objectiveNonzeros.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl = p_Stack_350;
    *(_Base_ptr *)((long)&(pHVar15->objectiveFunction).objectiveNonzeros + 8) = p_Stack_348;
    *(pointer *)((long)&(pHVar15->objectiveFunction).objectiveNonzeros + 0x10) = piStack_340;
    p_Stack_350 = (_Base_ptr)0x0;
    p_Stack_348 = (_Base_ptr)0x0;
    piStack_340 = (pointer)0x0;
    if (pvVar16 != (void *)0x0) {
      operator_delete(pvVar16);
    }
    pvVar16 = *(void **)&(pHVar15->objectiveFunction).objectiveVals.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl;
    *(pointer *)
     &(pHVar15->objectiveFunction).objectiveVals.super__Vector_base<double,_std::allocator<double>_>
      ._M_impl = ppStack_338;
    *(pointer *)((long)&(pHVar15->objectiveFunction).objectiveVals + 8) = ppStack_330;
    *(pointer *)((long)&(pHVar15->objectiveFunction).objectiveVals + 0x10) = local_328;
    ppStack_338 = (pointer)0x0;
    ppStack_330 = (pointer)0x0;
    local_328 = (pointer)0x0;
    if (pvVar16 != (void *)0x0) {
      operator_delete(pvVar16);
    }
    pvVar16 = *(void **)&(pHVar15->objectiveFunction).cliquePartitionStart.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl;
    *(pointer *)
     &(pHVar15->objectiveFunction).cliquePartitionStart.
      super__Vector_base<int,_std::allocator<int>_>._M_impl = pHStack_320;
    *(pointer *)((long)&(pHVar15->objectiveFunction).cliquePartitionStart + 8) = pHStack_318;
    *(pointer *)((long)&(pHVar15->objectiveFunction).cliquePartitionStart + 0x10) = pHStack_310;
    pHStack_320 = (pointer)0x0;
    pHStack_318 = (pointer)0x0;
    pHStack_310 = (pointer)0x0;
    if (pvVar16 != (void *)0x0) {
      operator_delete(pvVar16);
    }
    pvVar16 = *(void **)&(pHVar15->objectiveFunction).colToPartition.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl;
    *(pointer *)
     &(pHVar15->objectiveFunction).colToPartition.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl = pHStack_308;
    *(pointer *)((long)&(pHVar15->objectiveFunction).colToPartition + 8) = ppStack_300;
    *(pointer *)((long)&(pHVar15->objectiveFunction).colToPartition + 0x10) = local_2f8;
    pHStack_308 = (pointer)0x0;
    ppStack_300 = (pointer)0x0;
    local_2f8 = (pointer)0x0;
    if (pvVar16 != (void *)0x0) {
      operator_delete(pvVar16);
    }
    if (pHStack_308 != (pointer)0x0) {
      operator_delete(pHStack_308);
    }
    if (pHStack_320 != (pointer)0x0) {
      operator_delete(pHStack_320);
    }
    if (ppStack_338 != (pointer)0x0) {
      operator_delete(ppStack_338);
    }
    if (p_Stack_350 != (_Base_ptr)0x0) {
      operator_delete(p_Stack_350);
    }
    HighsDomain::HighsDomain((HighsDomain *)local_368,this->mipsolver);
    HighsDomain::operator=
              (&((this->mipsolver->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->domain,
               (HighsDomain *)local_368);
    HighsDomain::~HighsDomain((HighsDomain *)local_368);
    pHVar15 = (this->mipsolver->mipdata_)._M_t.
              super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
              _M_t.
              super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
              .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    HighsCliqueTable::rebuild
              (&pHVar15->cliquetable,this->model->num_col_,local_388,&pHVar15->domain,&local_3c0,
               &local_3a8);
    HighsImplications::rebuild
              (&((this->mipsolver->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->implications,
               this->model->num_col_,&local_3c0,&local_3a8);
    pHVar17 = this->mipsolver->options_mip_;
    HighsCutPool::HighsCutPool
              ((HighsCutPool *)local_368,this->mipsolver->model_->num_col_,
               (pHVar17->super_HighsOptionsStruct).mip_pool_age_limit,
               (pHVar17->super_HighsOptionsStruct).mip_pool_soft_limit);
    HighsCutPool::operator=
              (&((this->mipsolver->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->cutpool,
               (HighsCutPool *)local_368);
    HighsCutPool::~HighsCutPool((HighsCutPool *)local_368);
    pHVar17 = this->mipsolver->options_mip_;
    HighsConflictPool::HighsConflictPool
              ((HighsConflictPool *)local_368,
               (pHVar17->super_HighsOptionsStruct).mip_pool_age_limit * 5,
               (pHVar17->super_HighsOptionsStruct).mip_pool_soft_limit);
    pHVar15 = (this->mipsolver->mipdata_)._M_t.
              super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
              _M_t.
              super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
              .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    (pHVar15->conflictPool).agelim_ = local_368._0_4_;
    (pHVar15->conflictPool).softlimit_ = local_368._4_4_;
    pvVar16 = *(void **)&(pHVar15->conflictPool).ageDistribution_.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl;
    *(undefined8 *)
     &(pHVar15->conflictPool).ageDistribution_.super__Vector_base<int,_std::allocator<int>_>._M_impl
         = local_368._8_8_;
    *(_Base_ptr *)((long)&(pHVar15->conflictPool).ageDistribution_ + 8) = local_358;
    *(_Base_ptr *)((long)&(pHVar15->conflictPool).ageDistribution_ + 0x10) = p_Stack_350;
    local_368._8_8_ = (pointer)0x0;
    local_358 = (_Base_ptr)0x0;
    p_Stack_350 = (_Base_ptr)0x0;
    if (pvVar16 != (void *)0x0) {
      operator_delete(pvVar16);
    }
    pvVar16 = *(void **)&(pHVar15->conflictPool).ages_.
                         super__Vector_base<short,_std::allocator<short>_>._M_impl;
    *(_Base_ptr *)
     &(pHVar15->conflictPool).ages_.super__Vector_base<short,_std::allocator<short>_>._M_impl =
         p_Stack_348;
    *(pointer *)((long)&(pHVar15->conflictPool).ages_ + 8) = piStack_340;
    *(pointer *)((long)&(pHVar15->conflictPool).ages_ + 0x10) = ppStack_338;
    p_Stack_348 = (_Base_ptr)0x0;
    piStack_340 = (pointer)0x0;
    ppStack_338 = (pointer)0x0;
    if (pvVar16 != (void *)0x0) {
      operator_delete(pvVar16);
    }
    pvVar16 = *(void **)&(pHVar15->conflictPool).modification_.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
    *(pointer *)
     &(pHVar15->conflictPool).modification_.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl = ppStack_330;
    *(pointer *)((long)&(pHVar15->conflictPool).modification_ + 8) = local_328;
    *(pointer *)((long)&(pHVar15->conflictPool).modification_ + 0x10) = pHStack_320;
    ppStack_330 = (pointer)0x0;
    local_328 = (pointer)0x0;
    pHStack_320 = (pointer)0x0;
    if (pvVar16 != (void *)0x0) {
      operator_delete(pvVar16);
    }
    pvVar16 = *(void **)&(pHVar15->conflictPool).conflictEntries_.
                         super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                         _M_impl;
    *(pointer *)
     &(pHVar15->conflictPool).conflictEntries_.
      super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl =
         pHStack_318;
    *(pointer *)((long)&(pHVar15->conflictPool).conflictEntries_ + 8) = pHStack_310;
    *(pointer *)((long)&(pHVar15->conflictPool).conflictEntries_ + 0x10) = pHStack_308;
    pHStack_318 = (pointer)0x0;
    pHStack_310 = (pointer)0x0;
    pHStack_308 = (pointer)0x0;
    if (pvVar16 != (void *)0x0) {
      operator_delete(pvVar16);
    }
    pvVar16 = *(void **)&(pHVar15->conflictPool).conflictRanges_.
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl;
    *(pointer *)
     &(pHVar15->conflictPool).conflictRanges_.
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl =
         ppStack_300;
    *(pointer *)((long)&(pHVar15->conflictPool).conflictRanges_ + 8) = local_2f8;
    *(pointer *)((long)&(pHVar15->conflictPool).conflictRanges_ + 0x10) = ppStack_2f0;
    ppStack_300 = (pointer)0x0;
    local_2f8 = (pointer)0x0;
    ppStack_2f0 = (pointer)0x0;
    if (pvVar16 != (void *)0x0) {
      operator_delete(pvVar16);
    }
    std::
    _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
    ::clear(&(pHVar15->conflictPool).freeSpaces_._M_t);
    if (local_2e0._M_parent != (_Base_ptr)0x0) {
      (((_Rb_tree_header *)((long)&(pHVar15->conflictPool).freeSpaces_ + 8))->_M_header)._M_color =
           local_2e0._M_color;
      *(_Base_ptr *)((long)&(pHVar15->conflictPool).freeSpaces_ + 0x10) = local_2e0._M_parent;
      *(_Base_ptr *)((long)&(pHVar15->conflictPool).freeSpaces_ + 0x18) = local_2e0._M_left;
      *(_Base_ptr *)((long)&(pHVar15->conflictPool).freeSpaces_ + 0x20) = local_2e0._M_right;
      (local_2e0._M_parent)->_M_parent = (_Base_ptr)((long)&(pHVar15->conflictPool).freeSpaces_ + 8)
      ;
      *(pointer *)((long)&(pHVar15->conflictPool).freeSpaces_ + 0x28) = local_2c0;
      local_2e0._M_parent = (_Base_ptr)0x0;
      local_2c0 = (pointer)0x0;
      local_2e0._M_left = &local_2e0;
      local_2e0._M_right = &local_2e0;
    }
    pvVar16 = *(void **)&(pHVar15->conflictPool).deletedConflicts_.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl;
    *(pointer *)
     &(pHVar15->conflictPool).deletedConflicts_.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl = local_2b8;
    *(pointer *)((long)&(pHVar15->conflictPool).deletedConflicts_ + 8) = pHStack_2b0;
    *(pointer *)((long)&(pHVar15->conflictPool).deletedConflicts_ + 0x10) = local_2a8;
    local_2b8 = (pointer)0x0;
    pHStack_2b0 = (pointer)0x0;
    local_2a8 = (pointer)0x0;
    if (pvVar16 != (void *)0x0) {
      operator_delete(pvVar16);
    }
    pvVar16 = *(void **)&(pHVar15->conflictPool).propagationDomains.
                         super__Vector_base<HighsDomain::ConflictPoolPropagation_*,_std::allocator<HighsDomain::ConflictPoolPropagation_*>_>
                         ._M_impl;
    *(pointer *)
     &(pHVar15->conflictPool).propagationDomains.
      super__Vector_base<HighsDomain::ConflictPoolPropagation_*,_std::allocator<HighsDomain::ConflictPoolPropagation_*>_>
      ._M_impl = local_2a0;
    *(pointer *)((long)&(pHVar15->conflictPool).propagationDomains + 8) = ppCStack_298;
    *(pointer *)((long)&(pHVar15->conflictPool).propagationDomains + 0x10) = local_290;
    local_2a0 = (pointer)0x0;
    ppCStack_298 = (pointer)0x0;
    local_290 = (pointer)0x0;
    if (pvVar16 != (void *)0x0) {
      operator_delete(pvVar16);
    }
    HighsConflictPool::~HighsConflictPool((HighsConflictPool *)local_368);
    if (local_380 != 0) {
      puVar18 = (this->numProbes).
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar30 = 0;
      do {
        if ((long)local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar30] != -1) {
          puVar18[local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar30]] = puVar18[uVar30];
        }
        uVar30 = uVar30 + 1;
      } while (local_380 != uVar30);
    }
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
              (&this->numProbes,(long)this->model->num_col_);
    HighsLp::setMatrixDimensions(this->model);
  }
  HighsLp::setMatrixDimensions(this->model);
  HPresolveAnalysis::resetNumDeleted(&this->analysis_);
  if (local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HPresolve::shrinkProblem(HighsPostsolveStack& postsolve_stack) {
  HighsInt oldNumCol = model->num_col_;
  model->num_col_ = 0;
  std::vector<HighsInt> newColIndex(oldNumCol);
  const bool have_col_names = model->col_names_.size() > 0;
  assert(!have_col_names ||
         model->col_names_.size() == static_cast<size_t>(oldNumCol));
  for (HighsInt i = 0; i != oldNumCol; ++i) {
    if (colDeleted[i])
      newColIndex[i] = -1;
    else {
      newColIndex[i] = model->num_col_++;
      if (newColIndex[i] < i) {
        model->col_cost_[newColIndex[i]] = model->col_cost_[i];
        model->col_lower_[newColIndex[i]] = model->col_lower_[i];
        model->col_upper_[newColIndex[i]] = model->col_upper_[i];
        assert(!std::isnan(model->col_lower_[newColIndex[i]]));
        assert(!std::isnan(model->col_upper_[newColIndex[i]]));
        model->integrality_[newColIndex[i]] = model->integrality_[i];
        implColLower[newColIndex[i]] = implColLower[i];
        implColUpper[newColIndex[i]] = implColUpper[i];
        colLowerSource[newColIndex[i]] = colLowerSource[i];
        colUpperSource[newColIndex[i]] = colUpperSource[i];
        implRowDualSourceByCol[newColIndex[i]] = implRowDualSourceByCol[i];
        colhead[newColIndex[i]] = colhead[i];
        colsize[newColIndex[i]] = colsize[i];
        if (have_col_names)
          model->col_names_[newColIndex[i]] = std::move(model->col_names_[i]);
        changedColFlag[newColIndex[i]] = changedColFlag[i];
      }
    }
  }
  colDeleted.assign(model->num_col_, false);
  model->col_cost_.resize(model->num_col_);
  model->col_lower_.resize(model->num_col_);
  model->col_upper_.resize(model->num_col_);
  model->integrality_.resize(model->num_col_);
  implColLower.resize(model->num_col_);
  implColUpper.resize(model->num_col_);
  colLowerSource.resize(model->num_col_);
  colUpperSource.resize(model->num_col_);
  implRowDualSourceByCol.resize(model->num_col_);
  colhead.resize(model->num_col_);
  colsize.resize(model->num_col_);
  if (have_col_names) model->col_names_.resize(model->num_col_);
  changedColFlag.resize(model->num_col_);
  numDeletedCols = 0;
  HighsInt oldNumRow = model->num_row_;
  const bool have_row_names = model->row_names_.size() > 0;
  assert(!have_row_names ||
         model->row_names_.size() == static_cast<size_t>(oldNumRow));
  model->num_row_ = 0;
  std::vector<HighsInt> newRowIndex(oldNumRow);
  for (HighsInt i = 0; i != oldNumRow; ++i) {
    if (rowDeleted[i])
      newRowIndex[i] = -1;
    else {
      newRowIndex[i] = model->num_row_++;
      if (newRowIndex[i] < i) {
        model->row_lower_[newRowIndex[i]] = model->row_lower_[i];
        model->row_upper_[newRowIndex[i]] = model->row_upper_[i];
        assert(!std::isnan(model->row_lower_[newRowIndex[i]]));
        assert(!std::isnan(model->row_upper_[newRowIndex[i]]));
        rowDualLower[newRowIndex[i]] = rowDualLower[i];
        rowDualUpper[newRowIndex[i]] = rowDualUpper[i];
        implRowDualLower[newRowIndex[i]] = implRowDualLower[i];
        implRowDualUpper[newRowIndex[i]] = implRowDualUpper[i];
        rowDualLowerSource[newRowIndex[i]] = rowDualLowerSource[i];
        rowDualUpperSource[newRowIndex[i]] = rowDualUpperSource[i];
        colImplSourceByRow[newRowIndex[i]] = colImplSourceByRow[i];
        rowroot[newRowIndex[i]] = rowroot[i];
        rowsize[newRowIndex[i]] = rowsize[i];
        rowsizeInteger[newRowIndex[i]] = rowsizeInteger[i];
        rowsizeImplInt[newRowIndex[i]] = rowsizeImplInt[i];
        if (have_row_names)
          model->row_names_[newRowIndex[i]] = std::move(model->row_names_[i]);
        changedRowFlag[newRowIndex[i]] = changedRowFlag[i];
      }
    }
  }
  for (HighsInt i = 0; i != model->num_col_; ++i) {
    if (colLowerSource[i] != -1)
      colLowerSource[i] = newRowIndex[colLowerSource[i]];
    if (colUpperSource[i] != -1)
      colUpperSource[i] = newRowIndex[colUpperSource[i]];
  }

  for (HighsInt i = 0; i != model->num_row_; ++i) {
    if (rowDualLowerSource[i] != -1)
      rowDualLowerSource[i] = newColIndex[rowDualLowerSource[i]];
    if (rowDualUpperSource[i] != -1)
      rowDualUpperSource[i] = newColIndex[rowDualUpperSource[i]];
  }

  for (HighsInt i = 0; i != model->num_col_; ++i) {
    std::set<HighsInt> newSet;
    std::for_each(implRowDualSourceByCol[i].cbegin(),
                  implRowDualSourceByCol[i].cend(), [&](const HighsInt& row) {
                    if (newRowIndex[row] != -1)
                      newSet.emplace(newRowIndex[row]);
                  });
    implRowDualSourceByCol[i] = std::move(newSet);
  }

  for (HighsInt i = 0; i != model->num_row_; ++i) {
    std::set<HighsInt> newSet;
    std::for_each(colImplSourceByRow[i].cbegin(), colImplSourceByRow[i].cend(),
                  [&](const HighsInt& col) {
                    if (newColIndex[col] != -1)
                      newSet.emplace(newColIndex[col]);
                  });
    colImplSourceByRow[i] = std::move(newSet);
  }
  rowDeleted.assign(model->num_row_, false);
  model->row_lower_.resize(model->num_row_);
  model->row_upper_.resize(model->num_row_);
  rowDualLower.resize(model->num_row_);
  rowDualUpper.resize(model->num_row_);
  implRowDualLower.resize(model->num_row_);
  implRowDualUpper.resize(model->num_row_);
  rowDualLowerSource.resize(model->num_row_);
  rowDualUpperSource.resize(model->num_row_);
  colImplSourceByRow.resize(model->num_row_);
  rowroot.resize(model->num_row_);
  rowsize.resize(model->num_row_);
  rowsizeInteger.resize(model->num_row_);
  rowsizeImplInt.resize(model->num_row_);
  if (have_row_names) model->row_names_.resize(model->num_row_);
  changedRowFlag.resize(model->num_row_);

  numDeletedRows = 0;
  postsolve_stack.compressIndexMaps(newRowIndex, newColIndex);
  impliedRowBounds.shrink(newRowIndex, model->num_row_);
  impliedDualRowBounds.shrink(newColIndex, model->num_col_);

  HighsInt numNnz = Avalue.size();
  for (HighsInt i = 0; i != numNnz; ++i) {
    if (Avalue[i] == 0) continue;
    assert(newColIndex[Acol[i]] != -1);
    assert(newRowIndex[Arow[i]] != -1);
    Acol[i] = newColIndex[Acol[i]];
    Arow[i] = newRowIndex[Arow[i]];
  }

  // update index sets
  for (HighsInt& singCol : singletonColumns) singCol = newColIndex[singCol];
  singletonColumns.erase(
      std::remove(singletonColumns.begin(), singletonColumns.end(), -1),
      singletonColumns.end());

  for (HighsInt& chgCol : changedColIndices) chgCol = newColIndex[chgCol];
  changedColIndices.erase(
      std::remove(changedColIndices.begin(), changedColIndices.end(), -1),
      changedColIndices.end());

  for (HighsInt& singRow : singletonRows) singRow = newRowIndex[singRow];
  singletonRows.erase(
      std::remove(singletonRows.begin(), singletonRows.end(), -1),
      singletonRows.end());

  for (HighsInt& chgRow : changedRowIndices) chgRow = newRowIndex[chgRow];
  changedRowIndices.erase(
      std::remove(changedRowIndices.begin(), changedRowIndices.end(), -1),
      changedRowIndices.end());

  for (auto& rowColPair : substitutionOpportunities) {
    // skip deleted elements
    if (rowColPair.first == -1) continue;
    rowColPair.first = newRowIndex[rowColPair.first];
    rowColPair.second = newColIndex[rowColPair.second];
  }
  substitutionOpportunities.erase(
      std::remove_if(substitutionOpportunities.begin(),
                     substitutionOpportunities.end(),
                     [&](const std::pair<HighsInt, HighsInt>& p) {
                       return p.first == -1 || p.second == -1;
                     }),
      substitutionOpportunities.end());

  // todo remove equation set and replace with a vector of doubleton eqs
  equations.clear();
  eqiters.assign(model->num_row_, equations.end());
  for (HighsInt i = 0; i != model->num_row_; ++i) {
    if (model->row_lower_[i] == model->row_upper_[i])
      eqiters[i] = equations.emplace(rowsize[i], i).first;
  }

  if (mipsolver != nullptr) {
    mipsolver->mipdata_->rowMatrixSet = false;
    mipsolver->mipdata_->objectiveFunction = HighsObjectiveFunction(*mipsolver);
    mipsolver->mipdata_->domain = HighsDomain(*mipsolver);
    mipsolver->mipdata_->cliquetable.rebuild(model->num_col_, postsolve_stack,
                                             mipsolver->mipdata_->domain,
                                             newColIndex, newRowIndex);
    mipsolver->mipdata_->implications.rebuild(model->num_col_, newColIndex,
                                              newRowIndex);
    mipsolver->mipdata_->cutpool =
        HighsCutPool(mipsolver->model_->num_col_,
                     mipsolver->options_mip_->mip_pool_age_limit,
                     mipsolver->options_mip_->mip_pool_soft_limit);
    mipsolver->mipdata_->conflictPool =
        HighsConflictPool(5 * mipsolver->options_mip_->mip_pool_age_limit,
                          mipsolver->options_mip_->mip_pool_soft_limit);

    for (HighsInt i = 0; i != oldNumCol; ++i)
      if (newColIndex[i] != -1) numProbes[newColIndex[i]] = numProbes[i];

    mipsolver->mipdata_->debugSolution.shrink(newColIndex);
    numProbes.resize(model->num_col_);
    // Need to set the constraint matrix dimensions
    model->setMatrixDimensions();
  }
  // Need to set the constraint matrix dimensions
  model->setMatrixDimensions();
  // Need to reset current number of deleted rows and columns in logging
  analysis_.resetNumDeleted();
}